

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::cpp::CppGenerator::GenCreateParam_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  SymbolTable<flatbuffers::Value> *this_00;
  Value *type_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  Presence PVar5;
  StructDef *pSVar6;
  EnumDef *pEVar7;
  _Alloc_hider *p_Var8;
  CppGenerator *this_01;
  int iVar9;
  const_iterator cVar10;
  undefined8 *puVar11;
  long *plVar12;
  undefined8 *puVar13;
  size_type *psVar14;
  long *plVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  _Rb_tree_header *p_Var21;
  bool bVar22;
  string underlying_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_value;
  string type;
  string value;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  undefined1 local_170 [24];
  uint16_t uStack_158;
  undefined6 uStack_156;
  string *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  CppGenerator *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  SymbolTable<flatbuffers::Value> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"_o->","");
  local_128 = this;
  if ((field->value).type.base_type == BASE_TYPE_UTYPE) {
    Name_abi_cxx11_((string *)local_170,this,field);
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)local_170);
    std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((_Alloc_hider *)local_170._0_8_ != (_Alloc_hider *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    std::__cxx11::string::append((char *)&local_120);
  }
  else {
    Name_abi_cxx11_(&local_c0,this,field);
    std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_c0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  type_00 = &field->value;
  BVar4 = (type_00->type).base_type;
  bVar22 = false;
  if ((BVar4 != BASE_TYPE_VECTOR) && (bVar22 = false, BVar4 != BASE_TYPE_VECTOR64)) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"cpp_type","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                     *)&(field->super_Definition).attributes,&local_c0);
    if ((_Rb_tree_header *)cVar10._M_node ==
        &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      bVar22 = false;
    }
    else {
      bVar22 = *(long *)(cVar10._M_node + 2) != 0;
    }
  }
  if (((BVar4 != BASE_TYPE_VECTOR) && (BVar4 != BASE_TYPE_VECTOR64)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2)) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_150 = __return_storage_ptr__;
  if (bVar22) {
    GenTypeBasic_abi_cxx11_((string *)local_170,local_128,&type_00->type,false);
    std::operator+(&local_100,"_rehasher ? static_cast<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_148.field_2._M_allocated_capacity = *puVar13;
      local_148.field_2._8_8_ = puVar11[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *puVar13;
      local_148._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_148._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_120._M_dataplus._M_p);
    paVar1 = &local_190.field_2;
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_190.field_2._M_allocated_capacity = *puVar13;
      local_190.field_2._8_8_ = puVar11[3];
      local_190._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_190.field_2._M_allocated_capacity = *puVar13;
      local_190._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_190._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    GenPtrGet_abi_cxx11_(&local_e0,local_128,field);
    uVar19 = (EnumDef *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar1) {
      uVar19 = local_190.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < (EnumDef *)(local_e0._M_string_length + local_190._M_string_length)) {
      uVar19 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        uVar19 = local_e0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < (EnumDef *)(local_e0._M_string_length + local_190._M_string_length))
      goto LAB_0019fbc3;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_e0,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
    }
    else {
LAB_0019fbc3:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_e0._M_dataplus._M_p)
      ;
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1b0.field_2._M_allocated_capacity = *puVar13;
      local_1b0.field_2._8_8_ = puVar11[3];
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *puVar13;
      local_1b0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1b0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)puVar13 = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1d0.field_2._M_allocated_capacity = *puVar13;
      local_1d0.field_2._8_8_ = puVar11[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *puVar13;
      local_1d0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1d0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
    }
    __return_storage_ptr__ = local_150;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar1) {
      operator_delete(local_190._M_dataplus._M_p,
                      (ulong)(local_190.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      (ulong)(local_148.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((_Alloc_hider *)local_170._0_8_ != (_Alloc_hider *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
  }
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((type_00->type).base_type) {
  case BASE_TYPE_STRING:
    if (field->shared == false) {
      pcVar18 = "";
      if (field->offset64 != false) {
        pcVar18 = "<::flatbuffers::Offset64>";
      }
      pcVar16 = pcVar18 + 0x19;
      if (field->offset64 == false) {
        pcVar16 = pcVar18;
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,pcVar18,pcVar16);
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x36b7dc);
      puVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1d0.field_2._M_allocated_capacity = *puVar13;
        local_1d0.field_2._8_8_ = puVar11[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *puVar13;
        local_1d0._M_dataplus._M_p = (pointer)*puVar11;
      }
      local_1d0._M_string_length = puVar11[1];
      *puVar11 = puVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
      puVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_170._16_8_ = *puVar13;
        _uStack_158 = puVar11[3];
        local_170._0_8_ = (_Alloc_hider *)(local_170 + 0x10);
      }
      else {
        local_170._16_8_ = *puVar13;
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_170._8_8_ = puVar11[1];
      *puVar11 = puVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_150,local_170._0_8_);
      if ((_Alloc_hider *)local_170._0_8_ != (_Alloc_hider *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      __return_storage_ptr__ = local_150;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,
                        (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_120._M_dataplus._M_p);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    if (field->presence == kRequired) goto LAB_001a2625;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    std::__cxx11::string::append((char *)&local_190);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1b0.field_2._M_allocated_capacity = *puVar13;
      local_1b0.field_2._8_8_ = puVar11[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *puVar13;
      local_1b0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1b0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1d0.field_2._M_allocated_capacity = *puVar13;
      local_1d0.field_2._8_8_ = puVar11[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *puVar13;
      local_1d0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1d0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1d0,(ulong)(local_150->_M_dataplus)._M_p);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_170._16_8_ = *puVar13;
      _uStack_158 = puVar11[3];
      local_170._0_8_ = (_Alloc_hider *)(local_170 + 0x10);
    }
    else {
      local_170._16_8_ = *puVar13;
      local_170._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar11;
    }
    local_170._8_8_ = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_150,(string *)local_170);
    if ((_Alloc_hider *)local_170._0_8_ != (_Alloc_hider *)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
    }
    __return_storage_ptr__ = local_150;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
    }
    uVar19 = local_190.field_2._M_allocated_capacity;
    _Var20._M_p = local_190._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_001a2625;
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    local_170._0_4_ = (field->value).type.element;
    local_170._8_8_ = (field->value).type.struct_def;
    local_170._16_8_ = (field->value).type.enum_def;
    local_170._4_4_ = 0;
    uStack_158 = (field->value).type.fixed_length;
    if ((int)local_170._0_4_ < 0xd) {
      if (local_170._0_4_ == BASE_TYPE_UTYPE) {
        std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&local_120);
        std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
        }
        this_01 = local_128;
        GenTypeBasic_abi_cxx11_(&local_1d0,local_128,(Type *)local_170,false);
        if ((this_01->opts_).super_IDLOptions.scoped_enums == true) {
          EscapeKeyword(&local_1b0,this_01,(string *)(field->value).type.enum_def);
        }
        else {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,local_1d0._M_dataplus._M_p,
                     local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
        }
        std::operator+(&local_148,"__va->_",&local_120);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190.field_2._8_8_ = puVar11[3];
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_190._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        paVar1 = &local_148.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((local_128->opts_).super_IDLOptions.scoped_enums == false) {
          std::operator+(&local_a0,"static_cast<",&local_1d0);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_a0);
          plVar15 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15) {
            local_e0.field_2._M_allocated_capacity = *plVar15;
            local_e0.field_2._8_8_ = plVar12[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *plVar15;
            local_e0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_e0._M_string_length = plVar12[1];
          *plVar12 = (long)plVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_e0,(ulong)local_190._M_dataplus._M_p);
          psVar14 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_100.field_2._M_allocated_capacity = *psVar14;
            local_100.field_2._8_8_ = plVar12[3];
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          }
          else {
            local_100.field_2._M_allocated_capacity = *psVar14;
            local_100._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_100._M_string_length = plVar12[1];
          *plVar12 = (long)psVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
          puVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_148.field_2._M_allocated_capacity = *puVar13;
            local_148.field_2._8_8_ = puVar11[3];
            local_148._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar13;
            local_148._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_148._M_string_length = puVar11[1];
          *puVar11 = puVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_190,(string *)&local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_50,"_fbb.CreateVector<",&local_1b0);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_78 = &local_68;
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_68 = *plVar15;
          lStack_60 = plVar12[3];
        }
        else {
          local_68 = *plVar15;
          local_78 = (long *)*plVar12;
        }
        local_70 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_78,(ulong)local_120._M_dataplus._M_p);
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_a0.field_2._M_allocated_capacity = *psVar14;
          local_a0.field_2._8_8_ = plVar12[3];
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar14;
          local_a0._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_a0._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_a0);
        plVar15 = plVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar15) {
          local_e0.field_2._M_allocated_capacity = *plVar15;
          local_e0.field_2._8_8_ = plVar12[3];
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *plVar15;
          local_e0._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_e0._M_string_length = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_e0,(ulong)local_190._M_dataplus._M_p);
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_100.field_2._M_allocated_capacity = *psVar14;
          local_100.field_2._8_8_ = plVar12[3];
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar14;
          local_100._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_100._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_148.field_2._M_allocated_capacity = *puVar13;
          local_148.field_2._8_8_ = puVar11[3];
          local_148._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar13;
          local_148._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_148._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_150,(ulong)local_148._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        __return_storage_ptr__ = local_150;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          (ulong)(local_190.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_1d0.field_2._M_allocated_capacity;
        _Var20._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) goto LAB_001a2432;
      }
      else if (local_170._0_4_ == BASE_TYPE_BOOL) {
        std::operator+(&local_1b0,"_fbb.CreateVector(",&local_120);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1d0.field_2._M_allocated_capacity = *puVar13;
          local_1d0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *puVar13;
          local_1d0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1d0._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
LAB_001a2400:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_1b0.field_2._M_allocated_capacity;
        _Var20._M_p = local_1b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_001a2432;
      }
      else {
LAB_001a026a:
        pEVar7 = (field->value).type.enum_def;
        if (((pEVar7 != (EnumDef *)0x0) &&
            (((local_128->opts_).super_IDLOptions.scoped_enums != true ||
             (9 < local_170._0_4_ - BASE_TYPE_UTYPE || (EnumDef *)local_170._16_8_ == (EnumDef *)0x0
             )))) && ((*(int *)&(local_128->opts_).super_IDLOptions.field_0x30c < 2 ||
                      (((local_128->opts_).g_only_fixed_enums != true ||
                       (9 < local_170._0_4_ - BASE_TYPE_UTYPE ||
                        (EnumDef *)local_170._16_8_ == (EnumDef *)0x0)))))) {
          GenTypeBasic_abi_cxx11_(&local_1d0,local_128,&pEVar7->underlying_type,false);
          std::operator+(&local_a0,"_fbb.CreateVectorScalarCast<",&local_1d0);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_a0);
          plVar15 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15) {
            local_e0.field_2._M_allocated_capacity = *plVar15;
            local_e0.field_2._8_8_ = plVar12[3];
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0.field_2._M_allocated_capacity = *plVar15;
            local_e0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_e0._M_string_length = plVar12[1];
          *plVar12 = (long)plVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::operator+(&local_100,&local_e0,&local_120);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
          puVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_148.field_2._M_allocated_capacity = *puVar13;
            local_148.field_2._8_8_ = puVar11[3];
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar13;
            local_148._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_148._M_string_length = puVar11[1];
          *puVar11 = puVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::operator+(&local_190,&local_148,&local_120);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
          puVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_1b0.field_2._M_allocated_capacity = *puVar13;
            local_1b0.field_2._8_8_ = puVar11[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *puVar13;
            local_1b0._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_1b0._M_string_length = puVar11[1];
          *puVar11 = puVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_150,(ulong)local_1b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          __return_storage_ptr__ = local_150;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            (ulong)(local_190.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            (ulong)(local_e0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          uVar19 = local_1d0.field_2._M_allocated_capacity;
          _Var20._M_p = local_1d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001a242a;
          goto LAB_001a2432;
        }
        paVar1 = &local_1d0.field_2;
        local_1d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"cpp_type","");
        cVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                         *)&(field->super_Definition).attributes,&local_1d0);
        if ((_Rb_tree_header *)cVar10._M_node ==
            &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
          bVar22 = true;
        }
        else {
          bVar22 = *(long *)(cVar10._M_node + 2) == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
        }
        if (bVar22) {
          if ((type_00->type).base_type == BASE_TYPE_VECTOR64) {
            std::operator+(&local_1b0,"_fbb.CreateVector64(",&local_120);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
            puVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1d0.field_2._M_allocated_capacity = *puVar13;
              local_1d0.field_2._8_8_ = puVar11[3];
              local_1d0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar13;
              local_1d0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_1d0._M_string_length = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            if (field->offset64 == true) {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
            }
            std::operator+(&local_1b0,"(",&local_120);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
            puVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1d0.field_2._M_allocated_capacity = *puVar13;
              local_1d0.field_2._8_8_ = puVar11[3];
              local_1d0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar13;
              local_1d0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_1d0._M_string_length = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          }
          goto LAB_001a2400;
        }
        GenTypeBasic_abi_cxx11_(&local_1d0,local_128,(Type *)local_170,false);
        std::operator+(&local_100,"_fbb.CreateVector<",&local_1d0);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_100);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_148.field_2._M_allocated_capacity = *psVar14;
          local_148.field_2._8_8_ = plVar12[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar14;
          local_148._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_148._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_148,(ulong)local_120._M_dataplus._M_p);
        paVar2 = &local_190.field_2;
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_190.field_2._M_allocated_capacity = *psVar14;
          local_190.field_2._8_8_ = plVar12[3];
          local_190._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar14;
          local_190._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_190._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_190);
        paVar3 = &local_1b0.field_2;
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_1b0.field_2._M_allocated_capacity = *psVar14;
          local_1b0.field_2._8_8_ = plVar12[3];
          local_1b0._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar14;
          local_1b0._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_1b0._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar3) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::operator+(&local_190,"static_cast<",&local_1d0);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_190);
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_1b0.field_2._M_allocated_capacity = *psVar14;
          local_1b0.field_2._8_8_ = plVar12[3];
          local_1b0._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar14;
          local_1b0._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_1b0._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar3) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_100,"(__va->_",&local_120);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_148.field_2._M_allocated_capacity = *puVar13;
          local_148.field_2._8_8_ = puVar11[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar13;
          local_148._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_148._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        GenPtrGet_abi_cxx11_(&local_e0,local_128,field);
        uVar19 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          uVar19 = local_148.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < (EnumDef *)(local_e0._M_string_length + local_148._M_string_length)) {
          uVar19 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            uVar19 = local_e0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < (EnumDef *)(local_e0._M_string_length + local_148._M_string_length))
          goto LAB_001a200b;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_e0,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
        }
        else {
LAB_001a200b:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_148,(ulong)local_e0._M_dataplus._M_p);
        }
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190.field_2._8_8_ = puVar11[3];
          local_190._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_190._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1b0.field_2._M_allocated_capacity = *puVar13;
          local_1b0.field_2._8_8_ = puVar11[3];
          local_1b0._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *puVar13;
          local_1b0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1b0._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != paVar3) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar2) {
          operator_delete(local_190._M_dataplus._M_p,
                          (ulong)(local_190.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar19 = local_1d0.field_2._M_allocated_capacity;
        _Var20._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar1) goto LAB_001a2432;
      }
LAB_001a242a:
      operator_delete(_Var20._M_p,
                      (ulong)((long)&(((EnumDef *)uVar19)->super_Definition).name._M_dataplus._M_p +
                             1));
    }
    else {
      if (local_170._0_4_ == BASE_TYPE_STRING) {
        NativeString_abi_cxx11_(&local_1d0,local_128,field);
        iVar9 = std::__cxx11::string::compare((char *)&local_1d0);
        paVar1 = &local_1d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
        }
        if (iVar9 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_1b0,"(",&local_120);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          psVar14 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_1d0.field_2._M_allocated_capacity = *psVar14;
            local_1d0.field_2._8_8_ = plVar12[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *psVar14;
            local_1d0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1d0._M_string_length = plVar12[1];
          *plVar12 = (long)psVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_1b0,"return __va->__fbb->CreateString(__va->_",&local_120);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          plVar15 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15) {
            local_1d0.field_2._M_allocated_capacity = *plVar15;
            local_1d0.field_2._8_8_ = plVar12[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *plVar15;
            local_1d0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1d0._M_string_length = plVar12[1];
          *plVar12 = (long)plVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          goto LAB_001a21e1;
        }
        std::operator+(&local_1b0,"_fbb.CreateVectorOfStrings(",&local_120);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1d0.field_2._M_allocated_capacity = *puVar13;
          local_1d0.field_2._8_8_ = puVar11[3];
          local_1d0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *puVar13;
          local_1d0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1d0._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
        goto LAB_001a2400;
      }
      if (local_170._0_4_ == BASE_TYPE_STRUCT) {
        if (((StructDef *)local_170._8_8_)->fixed == true) {
          pSVar6 = (field->value).type.struct_def;
          paVar1 = &local_1d0.field_2;
          local_1d0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"native_type","");
          local_58 = &(pSVar6->super_Definition).attributes;
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_58,&local_1d0);
          p_Var21 = &(pSVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar10._M_node == p_Var21) {
            lVar17 = 0;
          }
          else {
            lVar17 = *(long *)(cVar10._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          if (lVar17 == 0) {
            if (((type_00->type).base_type == BASE_TYPE_VECTOR64) ||
               (std::__cxx11::string::append((char *)local_150), field->offset64 == true)) {
              std::__cxx11::string::append((char *)local_150);
            }
            std::operator+(&local_1b0,"(",&local_120);
            __return_storage_ptr__ = local_150;
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
            puVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1d0.field_2._M_allocated_capacity = *puVar13;
              local_1d0.field_2._8_8_ = puVar11[3];
              local_1d0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *puVar13;
              local_1d0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_1d0._M_string_length = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
            goto LAB_001a2400;
          }
          std::__cxx11::string::append((char *)local_150);
          uVar19 = local_170._8_8_;
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
          BaseGenerator::WrapInNameSpace
                    (&local_148,&local_128->super_BaseGenerator,(Definition *)uVar19,&local_100);
          puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
          puVar13 = puVar11 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_190.field_2._M_allocated_capacity = *puVar13;
            local_190.field_2._8_8_ = puVar11[3];
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          }
          else {
            local_190.field_2._M_allocated_capacity = *puVar13;
            local_190._M_dataplus._M_p = (pointer)*puVar11;
          }
          local_190._M_string_length = puVar11[1];
          *puVar11 = puVar13;
          puVar11[1] = 0;
          *(undefined1 *)(puVar11 + 2) = 0;
          std::operator+(&local_1b0,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar17 + 0x20));
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          plVar15 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15) {
            local_1d0.field_2._M_allocated_capacity = *plVar15;
            local_1d0.field_2._8_8_ = plVar12[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *plVar15;
            local_1d0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1d0._M_string_length = plVar12[1];
          *plVar12 = (long)plVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_150,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            (ulong)(local_190.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_1d0,"(",&local_120);
          std::__cxx11::string::_M_append((char *)local_150,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          local_1d0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"native_type_pack_name","");
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                           *)local_58,&local_1d0);
          __return_storage_ptr__ = local_150;
          if ((_Rb_tree_header *)cVar10._M_node == p_Var21) {
            lVar17 = 0;
          }
          else {
            lVar17 = *(long *)(cVar10._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          if (lVar17 != 0) {
            std::operator+(&local_1d0,", ::flatbuffers::Pack",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar17 + 0x20));
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1d0._M_dataplus._M_p,
                              (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
            }
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar19 = local_170._8_8_;
          paVar1 = &local_190.field_2;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
          BaseGenerator::WrapInNameSpace
                    (&local_1b0,&local_128->super_BaseGenerator,(Definition *)uVar19,&local_190);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          paVar2 = &local_1d0.field_2;
          psVar14 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_1d0.field_2._M_allocated_capacity = *psVar14;
            local_1d0.field_2._8_8_ = plVar12[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *psVar14;
            local_1d0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1d0._M_string_length = plVar12[1];
          *plVar12 = (long)psVar14;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          paVar3 = &local_1b0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != paVar3) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != paVar1) {
            operator_delete(local_190._M_dataplus._M_p,
                            (ulong)(local_190.field_2._M_allocated_capacity + 1));
          }
          std::operator+(&local_1b0,"(",&local_120);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          plVar15 = plVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15) {
            local_1d0.field_2._M_allocated_capacity = *plVar15;
            local_1d0.field_2._8_8_ = plVar12[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *plVar15;
            local_1d0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1d0._M_string_length = plVar12[1];
          *plVar12 = (long)plVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != paVar3) {
            operator_delete(local_1b0._M_dataplus._M_p,
                            (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::operator+(&local_1d0,"return Create",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170._8_8_);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_1d0._M_dataplus._M_p,
                            (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (field->native_inline == true) {
            std::operator+(&local_1b0,"&(__va->_",&local_120);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b0);
            plVar15 = plVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar15) {
              local_1d0.field_2._M_allocated_capacity = *plVar15;
              local_1d0.field_2._8_8_ = plVar12[3];
              local_1d0._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *plVar15;
              local_1d0._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_1d0._M_string_length = plVar12[1];
            *plVar12 = (long)plVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != paVar2) {
              operator_delete(local_1d0._M_dataplus._M_p,
                              (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
            }
            uVar19 = local_1b0.field_2._M_allocated_capacity;
            _Var20._M_p = local_1b0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != paVar3) {
LAB_001a21d2:
              operator_delete(_Var20._M_p,
                              (ulong)((long)&(((EnumDef *)uVar19)->super_Definition).name.
                                             _M_dataplus._M_p + 1));
            }
          }
          else {
            std::operator+(&local_190,"__va->_",&local_120);
            puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
            puVar13 = puVar11 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1b0.field_2._M_allocated_capacity = *puVar13;
              local_1b0.field_2._8_8_ = puVar11[3];
              local_1b0._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *puVar13;
              local_1b0._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_1b0._M_string_length = puVar11[1];
            *puVar11 = puVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            GenPtrGet_abi_cxx11_(&local_148,local_128,field);
            std::operator+(&local_1d0,&local_1b0,&local_148);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != paVar2) {
              operator_delete(local_1d0._M_dataplus._M_p,
                              (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != paVar3) {
              operator_delete(local_1b0._M_dataplus._M_p,
                              (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
            }
            uVar19 = local_190.field_2._M_allocated_capacity;
            _Var20._M_p = local_190._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != paVar1) goto LAB_001a21d2;
          }
LAB_001a21e1:
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else {
        if (local_170._0_4_ != BASE_TYPE_UNION) goto LAB_001a026a;
        std::operator+(&local_148,"_fbb.CreateVector<::flatbuffers::Offset<void>>(",&local_120);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190.field_2._8_8_ = puVar11[3];
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        }
        else {
          local_190.field_2._M_allocated_capacity = *puVar13;
          local_190._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_190._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_190,(ulong)local_120._M_dataplus._M_p);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1b0.field_2._M_allocated_capacity = *puVar13;
          local_1b0.field_2._8_8_ = puVar11[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *puVar13;
          local_1b0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1b0._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1d0.field_2._M_allocated_capacity = *puVar13;
          local_1d0.field_2._8_8_ = puVar11[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *puVar13;
          local_1d0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_1d0._M_string_length = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_150,(ulong)local_1d0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
        }
        __return_storage_ptr__ = local_150;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          (ulong)(local_190.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_148.field_2._M_allocated_capacity;
        _Var20._M_p = local_148._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_001a242a;
      }
    }
LAB_001a2432:
    paVar1 = &local_1d0.field_2;
    local_1d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"nested_flatbuffer","");
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                     *)&(field->super_Definition).attributes,&local_1d0);
    if (((_Rb_tree_header *)cVar10._M_node ==
         &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) ||
       (*(long *)(cVar10._M_node + 2) == 0)) {
      if ((local_128->opts_).super_IDLOptions.set_empty_vectors_to_null != true) {
        uVar19 = local_1d0.field_2._M_allocated_capacity;
        _Var20._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar1) goto LAB_001a2625;
        break;
      }
      PVar5 = field->presence;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
      }
      if (PVar5 == kRequired) goto LAB_001a2625;
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    std::__cxx11::string::append((char *)&local_190);
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_190,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1b0.field_2._M_allocated_capacity = *puVar13;
      local_1b0.field_2._8_8_ = puVar11[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *puVar13;
      local_1b0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1b0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1d0.field_2._M_allocated_capacity = *puVar13;
      local_1d0.field_2._8_8_ = puVar11[3];
      local_1d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *puVar13;
      local_1d0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1d0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_150,(string *)&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0._M_dataplus._M_p,
                      (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,
                      (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
    }
    uVar19 = local_190.field_2._M_allocated_capacity;
    _Var20._M_p = local_190._M_dataplus._M_p;
    __return_storage_ptr__ = local_150;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_001a2625;
    break;
  case BASE_TYPE_STRUCT:
    pSVar6 = (field->value).type.struct_def;
    if (pSVar6->fixed != true) {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,local_120._M_dataplus._M_p,
                 local_120._M_dataplus._M_p + local_120._M_string_length);
      std::__cxx11::string::append((char *)&local_1d0);
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1d0,
                           (ulong)(pSVar6->super_Definition).name._M_dataplus._M_p);
      p_Var8 = (_Alloc_hider *)(local_170 + 0x10);
      puVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_170._16_8_ = *puVar13;
        _uStack_158 = puVar11[3];
        local_170._0_8_ = p_Var8;
      }
      else {
        local_170._16_8_ = *puVar13;
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_170._8_8_ = puVar11[1];
      *puVar11 = puVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
      if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,
                        (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     "(_fbb, ",&local_120);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
      if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      if (field->native_inline == false) {
        GenPtrGet_abi_cxx11_((string *)local_170,local_128,field);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
        if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
          operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_001a2625;
    }
    p_Var8 = (_Alloc_hider *)(local_170 + 0x10);
    local_170._0_8_ = p_Var8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"native_type","");
    this_00 = &(pSVar6->super_Definition).attributes;
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                     *)this_00,(key_type *)local_170);
    p_Var21 = &(pSVar6->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar10._M_node == p_Var21) {
      bVar22 = true;
    }
    else {
      bVar22 = *(long *)(cVar10._M_node + 2) == 0;
    }
    if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
      operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
    }
    if (bVar22) {
      if (field->native_inline == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,"&",&local_120);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
        uVar19 = local_170._16_8_;
        _Var20._M_p = (pointer)local_170._0_8_;
        if ((_Alloc_hider *)local_170._0_8_ == p_Var8) goto LAB_001a2625;
      }
      else {
        std::operator+(&local_190,&local_120," ? ");
        std::operator+(&local_1b0,&local_190,&local_120);
        GenPtrGet_abi_cxx11_(&local_148,local_128,field);
        std::operator+(&local_1d0,&local_1b0,&local_148);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
        puVar13 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_170._16_8_ = *puVar13;
          _uStack_158 = puVar11[3];
          local_170._0_8_ = p_Var8;
        }
        else {
          local_170._16_8_ = *puVar13;
          local_170._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar11;
        }
        local_170._8_8_ = puVar11[1];
        *puVar11 = puVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
        if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
          operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,
                          (ulong)(local_1d0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,
                          (ulong)(local_1b0.field_2._M_allocated_capacity + 1));
        }
        uVar19 = local_190.field_2._M_allocated_capacity;
        _Var20._M_p = local_190._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p == &local_190.field_2) goto LAB_001a2625;
      }
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_170._0_8_ = p_Var8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,"native_type_pack_name","");
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                       *)this_00,(key_type *)local_170);
      if ((_Rb_tree_header *)cVar10._M_node == p_Var21) {
        lVar17 = 0;
      }
      else {
        lVar17 = *(long *)(cVar10._M_node + 2);
      }
      if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      if (lVar17 != 0) {
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(lVar17 + 0x20));
      }
      std::operator+(&local_1d0,"(",&local_120);
      puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
      puVar13 = puVar11 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_170._16_8_ = *puVar13;
        _uStack_158 = puVar11[3];
        local_170._0_8_ = p_Var8;
      }
      else {
        local_170._16_8_ = *puVar13;
        local_170._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar11;
      }
      local_170._8_8_ = puVar11[1];
      *puVar11 = puVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
      if ((_Alloc_hider *)local_170._0_8_ != p_Var8) {
        operator_delete((void *)local_170._0_8_,(ulong)(local_170._16_8_ + 1));
      }
      uVar19 = local_1d0.field_2._M_allocated_capacity;
      _Var20._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) goto LAB_001a2625;
    }
    break;
  case BASE_TYPE_UNION:
    local_170._0_8_ = (_Alloc_hider *)(local_170 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    std::__cxx11::string::append((char *)local_170);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_170._0_8_);
    uVar19 = local_170._16_8_;
    _Var20._M_p = (pointer)local_170._0_8_;
    if ((_Alloc_hider *)local_170._0_8_ == (_Alloc_hider *)(local_170 + 0x10)) goto LAB_001a2625;
    break;
  default:
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_120._M_dataplus._M_p);
    goto LAB_001a2625;
  }
  operator_delete(_Var20._M_p,
                  (ulong)((long)&(((EnumDef *)uVar19)->super_Definition).name._M_dataplus._M_p + 1))
  ;
LAB_001a2625:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenCreateParam(const FieldDef &field) {
    std::string value = "_o->";
    if (field.value.type.base_type == BASE_TYPE_UTYPE) {
      value += StripUnionType(Name(field));
      value += ".type";
    } else {
      value += Name(field);
    }
    if (!IsVector(field.value.type) && field.attributes.Lookup("cpp_type")) {
      auto type = GenTypeBasic(field.value.type, false);
      value =
          "_rehasher ? "
          "static_cast<" +
          type + ">((*_rehasher)(" + value + GenPtrGet(field) + ")) : 0";
    }

    std::string code;
    switch (field.value.type.base_type) {
      // String fields are of the form:
      //   _fbb.CreateString(_o->field)
      // or
      //   _fbb.CreateSharedString(_o->field)
      case BASE_TYPE_STRING: {
        if (!field.shared) {
          code +=
              "_fbb.CreateString" +
              std::string(field.offset64 ? "<::flatbuffers::Offset64>" : "") +
              "(";
        } else {
          code += "_fbb.CreateSharedString(";
        }
        code += value;
        code.push_back(')');

        // For optional fields, check to see if there actually is any data
        // in _o->field before attempting to access it. If there isn't,
        // depending on set_empty_strings_to_null either set it to 0 or an empty
        // string.
        if (!field.IsRequired()) {
          auto empty_value = opts_.set_empty_strings_to_null
                                 ? "0"
                                 : "_fbb.CreateSharedString(\"\")";
          code = value + ".empty() ? " + empty_value + " : " + code;
        }
        break;
      }
        // Vector fields come in several flavours, of the forms:
        //   _fbb.CreateVector(_o->field);
        //   _fbb.CreateVector((const utype*)_o->field.data(),
        //   _o->field.size()); _fbb.CreateVectorOfStrings(_o->field)
        //   _fbb.CreateVectorOfStructs(_o->field)
        //   _fbb.CreateVector<Offset<T>>(_o->field.size() [&](size_t i) {
        //     return CreateT(_fbb, _o->Get(i), rehasher);
        //   });
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto vector_type = field.value.type.VectorType();
        switch (vector_type.base_type) {
          case BASE_TYPE_STRING: {
            if (NativeString(&field) == "std::string") {
              code += "_fbb.CreateVectorOfStrings(" + value + ")";
            } else {
              // Use by-function serialization to emulate
              // CreateVectorOfStrings(); this works also with non-std strings.
              code +=
                  "_fbb.CreateVector<::flatbuffers::Offset<::flatbuffers::"
                  "String>>"
                  " ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code +=
                  "return __va->__fbb->CreateString(__va->_" + value + "[i]);";
              code += " }, &_va )";
            }
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (IsStruct(vector_type)) {
              const auto &struct_attrs =
                  field.value.type.struct_def->attributes;
              const auto native_type = struct_attrs.Lookup("native_type");
              if (native_type) {
                code += "_fbb.CreateVectorOfNativeStructs<";
                code += WrapInNameSpace(*vector_type.struct_def) + ", " +
                        native_type->constant + ">";
                code += "(" + value;
                const auto pack_name =
                    struct_attrs.Lookup("native_type_pack_name");
                if (pack_name) {
                  code += ", ::flatbuffers::Pack" + pack_name->constant;
                }
                code += ")";
              } else {
                // If the field uses 64-bit addressing, create a 64-bit vector.
                if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                  code += "_fbb.CreateVectorOfStructs64";
                } else {
                  code += "_fbb.CreateVectorOfStructs";
                  if (field.offset64) {
                    // This is normal 32-bit vector, with 64-bit addressing.
                    code += "64<::flatbuffers::Vector>";
                  }
                }
                code += "(" + value + ")";
              }
            } else {
              code += "_fbb.CreateVector<::flatbuffers::Offset<";
              code += WrapInNameSpace(*vector_type.struct_def) + ">> ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return Create" + vector_type.struct_def->name;
              code += "(*__va->__fbb, ";
              if (field.native_inline) {
                code += "&(__va->_" + value + "[i])";
              } else {
                code += "__va->_" + value + "[i]" + GenPtrGet(field);
              }
              code += ", __va->__rehasher); }, &_va )";
            }
            break;
          }
          case BASE_TYPE_BOOL: {
            code += "_fbb.CreateVector(" + value + ")";
            break;
          }
          case BASE_TYPE_UNION: {
            code +=
                "_fbb.CreateVector<::flatbuffers::"
                "Offset<void>>(" +
                value +
                ".size(), [](size_t i, _VectorArgs *__va) { "
                "return __va->_" +
                value + "[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va)";
            break;
          }
          case BASE_TYPE_UTYPE: {
            value = StripUnionType(value);
            auto underlying_type = GenTypeBasic(vector_type, false);
            const std::string &type = opts_.scoped_enums
                                          ? Name(*field.value.type.enum_def)
                                          : underlying_type;
            auto enum_value = "__va->_" + value + "[i].type";
            if (!opts_.scoped_enums)
              enum_value =
                  "static_cast<" + underlying_type + ">(" + enum_value + ")";

            code += "_fbb.CreateVector<" + type + ">(" + value +
                    ".size(), [](size_t i, _VectorArgs *__va) { return " +
                    enum_value + "; }, &_va)";
            break;
          }
          default: {
            if (field.value.type.enum_def &&
                !VectorElementUserFacing(vector_type)) {
              // For enumerations, we need to get access to the array data for
              // the underlying storage type (eg. uint8_t).
              const auto basetype = GenTypeBasic(
                  field.value.type.enum_def->underlying_type, false);
              code += "_fbb.CreateVectorScalarCast<" + basetype +
                      ">(::flatbuffers::data(" + value + "), " + value +
                      ".size())";
            } else if (field.attributes.Lookup("cpp_type")) {
              auto type = GenTypeBasic(vector_type, false);
              code += "_fbb.CreateVector<" + type + ">(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return __va->__rehasher ? ";
              code += "static_cast<" + type + ">((*__va->__rehasher)";
              code += "(__va->_" + value + "[i]" + GenPtrGet(field) + ")) : 0";
              code += "; }, &_va )";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                code += "_fbb.CreateVector64(" + value + ")";
              } else {
                code += "_fbb.CreateVector";
                if (field.offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code += "64<::flatbuffers::Vector>";
                }
                code += "(" + value + ")";
              }
            }
            break;
          }
        }

        // If set_empty_vectors_to_null option is enabled, for optional fields,
        // check to see if there actually is any data in _o->field before
        // attempting to access it.
        if (field.attributes.Lookup("nested_flatbuffer") ||
            (opts_.set_empty_vectors_to_null && !field.IsRequired())) {
          code = value + ".size() ? " + code + " : 0";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        // _o->field.Pack(_fbb);
        code += value + ".Pack(_fbb)";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(field.value.type)) {
          const auto &struct_attribs = field.value.type.struct_def->attributes;
          const auto native_type = struct_attribs.Lookup("native_type");
          if (native_type) {
            code += "::flatbuffers::Pack";
            const auto pack_name =
                struct_attribs.Lookup("native_type_pack_name");
            if (pack_name) { code += pack_name->constant; }
            code += "(" + value + ")";
          } else if (field.native_inline) {
            code += "&" + value;
          } else {
            code += value + " ? " + value + GenPtrGet(field) + " : nullptr";
          }
        } else {
          // _o->field ? CreateT(_fbb, _o->field.get(), _rehasher);
          const std::string &type = field.value.type.struct_def->name;
          code += value + " ? Create" + type;
          code += "(_fbb, " + value;
          if (!field.native_inline) code += GenPtrGet(field);
          code += ", _rehasher) : 0";
        }
        break;
      }
      default: {
        code += value;
        break;
      }
    }
    return code;
  }